

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::insert
          (SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *this,uint *key)

{
  uint uVar1;
  uint *puVar2;
  uint *item;
  uint i;
  uint local_1c;
  uint bucket;
  uint bucketMask;
  uint *key_local;
  SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *this_local;
  
  _bucket = key;
  key_local = &this->bucketCount;
  if (*key == 0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0xd9,
                  "void SmallDenseSet<unsigned int, SmallDenseMapUnsignedHasher, 32>::insert(const Key &) [Key = unsigned int, Hasher = SmallDenseMapUnsignedHasher, N = 32]"
                 );
  }
  if (this->bucketCount <= this->count + (this->count >> 2)) {
    rehash(this);
  }
  local_1c = this->bucketCount - 1;
  uVar1 = SmallDenseMapUnsignedHasher::operator()
                    ((SmallDenseMapUnsignedHasher *)((long)&item + 7),*_bucket);
  item._0_4_ = 0;
  while( true ) {
    i = uVar1 & local_1c;
    if (this->bucketCount <= (uint)item) {
      __assert_fail("!\"couldn\'t insert node\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                    ,0xf5,
                    "void SmallDenseSet<unsigned int, SmallDenseMapUnsignedHasher, 32>::insert(const Key &) [Key = unsigned int, Hasher = SmallDenseMapUnsignedHasher, N = 32]"
                   );
    }
    puVar2 = this->data + i;
    if (*puVar2 == 0) break;
    if (*puVar2 == *_bucket) {
      return;
    }
    uVar1 = i + (uint)item + 1;
    item._0_4_ = (uint)item + 1;
  }
  *puVar2 = *_bucket;
  this->count = this->count + 1;
  return;
}

Assistant:

void insert(const Key& key)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
			{
				item = key;

				count++;
				return;
			}

			if(item == key)
				return;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}